

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APInt.h
# Opt level: O2

void __thiscall llvm::APInt::ashrInPlace(APInt *this,uint ShiftAmt)

{
  uint B;
  byte bVar1;
  int64_t iVar2;
  
  B = this->BitWidth;
  if (B < ShiftAmt) {
    __assert_fail("ShiftAmt <= BitWidth && \"Invalid shift amount\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/APInt.h"
                  ,0x3ba,"void llvm::APInt::ashrInPlace(unsigned int)");
  }
  if (B < 0x41) {
    iVar2 = SignExtend64((this->U).VAL,B);
    bVar1 = 0x3f;
    if (this->BitWidth != ShiftAmt) {
      bVar1 = (byte)ShiftAmt;
    }
    (this->U).VAL = iVar2 >> (bVar1 & 0x3f);
    clearUnusedBits(this);
    return;
  }
  ashrSlowCase(this,ShiftAmt);
  return;
}

Assistant:

void ashrInPlace(unsigned ShiftAmt) {
    assert(ShiftAmt <= BitWidth && "Invalid shift amount");
    if (isSingleWord()) {
      int64_t SExtVAL = SignExtend64(U.VAL, BitWidth);
      if (ShiftAmt == BitWidth)
        U.VAL = SExtVAL >> (APINT_BITS_PER_WORD - 1); // Fill with sign bit.
      else
        U.VAL = SExtVAL >> ShiftAmt;
      clearUnusedBits();
      return;
    }
    ashrSlowCase(ShiftAmt);
  }